

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VectorIO.cpp
# Opt level: O3

void amrex::readLongData(Long *data,size_t size,istream *is,IntDescriptor *id)

{
  bool bVar1;
  int iVar2;
  IntDescriptor *id_00;
  
  id_00 = FPC::NativeLongDescriptor();
  bVar1 = IntDescriptor::operator==(id,id_00);
  iVar2 = IntDescriptor::numBytes(id);
  if (bVar1) {
    std::istream::read((char *)is,(long)data);
    return;
  }
  if (iVar2 == 2) {
    readIntData<long,short>(data,size,is,id);
    return;
  }
  iVar2 = IntDescriptor::numBytes(id);
  if (iVar2 == 4) {
    readIntData<long,int>(data,size,is,id);
    return;
  }
  iVar2 = IntDescriptor::numBytes(id);
  if (iVar2 == 8) {
    readIntData<long,long>(data,size,is,id);
    return;
  }
  Error_host("Don\'t know how to work with this long type.");
  return;
}

Assistant:

void amrex::readLongData (Long* data, std::size_t size, std::istream& is,
                          const IntDescriptor& id)
{
    if (id == FPC::NativeLongDescriptor())
    {
        is.read((char*) data, size * id.numBytes());
    }
    else if (id.numBytes() == 2)
    {
        readIntData<Long, std::int16_t>(data, size, is, id);
    }
    else if (id.numBytes() == 4)
    {
        readIntData<Long, std::int32_t>(data, size, is, id);
    }
    else if (id.numBytes() == 8)
    {
        readIntData<Long, std::int64_t>(data, size, is, id);
    }
    else {
        amrex::Error("Don't know how to work with this long type.");
    }
}